

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_GeometryFingerprint::Write(ON_GeometryFingerprint *this,ON_BinaryArchive *binary_archive)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ON_3dPoint *pOVar4;
  
  bVar2 = ON_BinaryArchive::WriteInt(binary_archive,this->m_topologyCRC);
  if ((bVar2) &&
     (bVar2 = ON_BinaryArchive::WritePoint(binary_archive,(this->m_pointWAH).m_sum), bVar2)) {
    pOVar4 = (this->m_pointWAH).m_sum;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      pOVar4 = pOVar4 + 1;
      if (uVar3 == 4) break;
      bVar2 = ON_BinaryArchive::WritePoint(binary_archive,pOVar4);
      uVar1 = uVar3 + 1;
    } while (bVar2);
    if ((3 < uVar3) &&
       (bVar2 = ON_BinaryArchive::WritePoint(binary_archive,(this->m_edgeWAH).m_sum), bVar2)) {
      pOVar4 = (this->m_edgeWAH).m_sum;
      uVar1 = 0;
      do {
        uVar3 = uVar1;
        pOVar4 = pOVar4 + 1;
        if (uVar3 == 4) break;
        bVar2 = ON_BinaryArchive::WritePoint(binary_archive,pOVar4);
        uVar1 = uVar3 + 1;
      } while (bVar2);
      return 3 < uVar3;
    }
  }
  return false;
}

Assistant:

bool ON_GeometryFingerprint::Write(ON_BinaryArchive& binary_archive) const
{
  if (!binary_archive.WriteInt(m_topologyCRC))
    return false;
  if (!m_pointWAH.Write(binary_archive))
    return false;
  if (!m_edgeWAH.Write(binary_archive))
    return false;
  return true;
}